

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_path_handle_graph.cpp
# Opt level: O2

void __thiscall
handlegraph::MutablePathHandleGraph::pop_front_step
          (MutablePathHandleGraph *this,path_handle_t *path_handle)

{
  step_handle_t next;
  step_handle_t begin;
  _Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> local_68;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  undefined1 local_30 [32];
  
  local_40 = (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0x168)) + 0xe8))
                       (&this->field_0x0 + *(long *)(*(long *)this + -0x168));
  local_50 = (**(code **)(*(long *)(&this->field_0x0 + *(long *)(*(long *)this + -0x168)) + 0x118))
                       (&this->field_0x0 + *(long *)(*(long *)this + -0x168),local_40);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*(long *)this + 0x188))(local_30,this,local_40);
  std::_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~_Vector_base
            (&local_68);
  return;
}

Assistant:

void MutablePathHandleGraph::pop_front_step(const path_handle_t& path_handle) {
    step_handle_t begin = path_begin(path_handle);
    step_handle_t next = get_next_step(begin);
    rewrite_segment(begin, next, std::vector<handle_t>());
}